

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O0

void Omega_h::add_implied_metric_based_on_target(Mesh *mesh)

{
  Int IVar1;
  TagBase *pTVar2;
  allocator local_39;
  string local_38 [32];
  TagBase *local_18;
  TagBase *target_tagbase;
  Mesh *mesh_local;
  
  target_tagbase = (TagBase *)mesh;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"target_metric",&local_39);
  pTVar2 = Mesh::get_tagbase(mesh,0,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pTVar2;
  IVar1 = Mesh::dim((Mesh *)target_tagbase);
  if ((1 < IVar1) && (IVar1 = TagBase::ncomps(local_18), IVar1 == 1)) {
    add_implied_isos_tag((Mesh *)target_tagbase);
    return;
  }
  add_implied_metric_tag((Mesh *)target_tagbase);
  return;
}

Assistant:

void add_implied_metric_based_on_target(Mesh* mesh) {
  auto target_tagbase = mesh->get_tagbase(VERT, "target_metric");
  if (mesh->dim() > 1 && target_tagbase->ncomps() == 1) {
    add_implied_isos_tag(mesh);
  } else {
    add_implied_metric_tag(mesh);
  }
}